

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DataTypeApplyFromText(char *buf,ImGuiDataType data_type,void *p_data,char *format)

{
  char cVar1;
  ulong __n;
  ulong uVar2;
  undefined1 uVar3;
  int iVar4;
  undefined4 *puVar5;
  char *fmt_out;
  bool bVar6;
  int v32;
  ImGuiDataTypeTempStorage data_backup;
  char format_sanitized [32];
  undefined4 local_74;
  ulong local_70;
  char *local_68;
  undefined1 local_60 [8];
  char local_58 [40];
  
  uVar2 = (ulong)(uint)data_type;
  while( true ) {
    cVar1 = *buf;
    if ((cVar1 != '\t') && (cVar1 != ' ')) break;
    buf = buf + 1;
  }
  if (cVar1 == '\0') {
    bVar6 = false;
  }
  else {
    local_68 = format;
    if (9 < (uint)data_type) {
      __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                    ,0x788,"const ImGuiDataTypeInfo *ImGui::DataTypeGetInfo(ImGuiDataType)");
    }
    __n = GDataTypeInfo[uVar2].Size;
    local_70 = uVar2;
    memcpy(local_60,p_data,__n);
    if ((data_type & 0xeU) == 8) {
      fmt_out = GDataTypeInfo[uVar2].ScanFmt;
    }
    else {
      fmt_out = local_58;
      ImParseFormatSanitizeForScanning(local_68,fmt_out,0x20);
    }
    local_74 = 0;
    puVar5 = &local_74;
    if (3 < __n) {
      puVar5 = (undefined4 *)p_data;
    }
    bVar6 = false;
    iVar4 = __isoc99_sscanf(buf,fmt_out,puVar5);
    if (0 < iVar4) {
      if (__n < 4) {
        if ((uint)data_type < 4) {
          uVar3 = (*(code *)(&DAT_001c9190 + *(int *)(&DAT_001c9190 + local_70 * 4)))();
          return (bool)uVar3;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                      ,0x7fa,
                      "bool ImGui::DataTypeApplyFromText(const char *, ImGuiDataType, void *, const char *)"
                     );
      }
      iVar4 = bcmp(local_60,p_data,__n);
      bVar6 = iVar4 != 0;
    }
  }
  return bVar6;
}

Assistant:

bool ImGui::DataTypeApplyFromText(const char* buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    // Sanitize format
    // For float/double we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in, so force them into %f and %lf
    char format_sanitized[32];
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        format = type_info->ScanFmt;
    else
        format = ImParseFormatSanitizeForScanning(format, format_sanitized, IM_ARRAYSIZE(format_sanitized));

    // Small types need a 32-bit buffer to receive the result from scanf()
    int v32 = 0;
    if (sscanf(buf, format, type_info->Size >= 4 ? p_data : &v32) < 1)
        return false;
    if (type_info->Size < 4)
    {
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}